

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector.cc
# Opt level: O1

double * __thiscall fizplex::SVector::operator[](SVector *this,size_t ind)

{
  pointer pNVar1;
  ulong uVar2;
  pointer in_RAX;
  pointer pNVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  bool bVar7;
  
  pNVar3 = (this->values).
           super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  lVar4 = (long)(this->values).
                super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar3;
  bVar7 = lVar4 != 0;
  if (bVar7) {
    uVar5 = lVar4 >> 4;
    if (pNVar3->index != ind) {
      uVar2 = 1;
      do {
        uVar6 = uVar2;
        if (uVar5 + (uVar5 == 0) == uVar6) {
          bVar7 = uVar6 < uVar5;
          goto LAB_001723ed;
        }
        in_RAX = pNVar3 + 1;
        pNVar1 = pNVar3 + 1;
        uVar2 = uVar6 + 1;
        pNVar3 = in_RAX;
      } while (pNVar1->index != ind);
      bVar7 = uVar6 < uVar5;
    }
    in_RAX = (pointer)&pNVar3->value;
  }
LAB_001723ed:
  if (!bVar7) {
    add_value(this,ind,0.0);
    in_RAX = (pointer)&(this->values).
                       super__Vector_base<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>
                       ._M_impl.super__Vector_impl_data._M_finish[-1].value;
  }
  return (double *)in_RAX;
}

Assistant:

double &SVector::operator[](size_t ind) {
  for (size_t i = 0; i < values.size(); ++i) {
    if (values[i].index == ind)
      return values[i].value;
  }
  add_value(ind, 0.0);
  return values.back().value;
}